

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_math.cpp
# Opt level: O2

double crnlib::math::compute_entropy(uint8 *p,uint n)

{
  uint i;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint hist [256];
  uint local_418 [256];
  
  memset(local_418,0,0x400);
  for (lVar1 = 0; n != (uint)lVar1; lVar1 = lVar1 + 1) {
    local_418[p[lVar1]] = local_418[p[lVar1]] + 1;
  }
  dVar2 = 0.0;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    if (local_418[lVar1] != 0) {
      dVar4 = (double)local_418[lVar1];
      dVar3 = log(dVar4 / (double)n);
      dVar2 = dVar2 + dVar3 * -1.4426950216293335 * dVar4;
    }
  }
  return dVar2;
}

Assistant:

double compute_entropy(const uint8* p, uint n)
        {
            uint hist[256];
            utils::zero_object(hist);

            for (uint i = 0; i < n; i++)
            {
                hist[*p++]++;
            }

            double entropy = 0.0f;

            const double invln2 = 1.0f / log(2.0f);
            for (uint i = 0; i < 256; i++)
            {
                if (!hist[i])
                {
                    continue;
                }

                double prob = static_cast<double>(hist[i]) / n;
                entropy += (-log(prob) * invln2) * hist[i];
            }

            return entropy;
        }